

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

ON_Xform * __thiscall ON_XMLVariant::AsXform(ON_Xform *__return_storage_ptr__,ON_XMLVariant *this)

{
  Types TVar1;
  bool bVar2;
  ON_XMLVariant *this_local;
  
  TVar1 = this->_private->_type;
  if (TVar1 == String) {
    bVar2 = ON_wString::IsValidMatrix(&this->_private->_string_val);
    if (bVar2) {
      (*this->_vptr_ON_XMLVariant[0x31])(this,0x10);
      memcpy(__return_storage_ptr__,&this->_private->field_2,0x80);
      return __return_storage_ptr__;
    }
  }
  else if (TVar1 == Matrix) {
    memcpy(__return_storage_ptr__,&this->_private->field_2,0x80);
    return __return_storage_ptr__;
  }
  memcpy(__return_storage_ptr__,&ON_Xform::Zero4x4,0x80);
  return __return_storage_ptr__;
}

Assistant:

ON_Xform ON_XMLVariant::AsXform(void) const
{
  switch (_private->_type)
  {
  case Types::Matrix:
    return _private->m_xform;

  case Types::String:
    if (_private->_string_val.IsValidMatrix())
    {
      StringToPoint(16);
      return _private->m_xform;
    }

  default:
    return ON_Xform::Zero4x4;
  }
}